

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O0

void __thiscall Clasp::ClaspConfig::reset(ClaspConfig *this)

{
  long in_RDI;
  SolveOptions *in_stack_ffffffffffffff58;
  Impl *in_stack_ffffffffffffff60;
  SolveOptions *this_00;
  undefined8 local_8c;
  uint64 local_78;
  uint64 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  ScheduleStrategy local_58;
  Algorithm local_48;
  int64 iStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  pointer local_28;
  undefined8 uStack_20;
  pointer local_18;
  BasicSatConfig *in_stack_fffffffffffffff0;
  
  if (*(long *)(in_RDI + 0xc0) != 0) {
    (**(code **)(**(long **)(in_RDI + 0xc0) + 0x68))();
  }
  Impl::reset(in_stack_ffffffffffffff60);
  BasicSatConfig::reset(in_stack_fffffffffffffff0);
  local_18 = (pointer)0x0;
  local_28 = (pointer)0x0;
  uStack_20._0_4_ = 0;
  uStack_20._4_4_ = 0;
  local_38._0_4_ = enum_auto;
  local_38._4_4_ = ignore;
  uStack_30._0_4_ = Implicit;
  uStack_30._4_4_ = 0;
  local_48.threads = 0;
  local_48.mode = mode_split;
  iStack_40 = 0;
  local_58._0_4_ = 0;
  local_58.idx = 0;
  local_58.len = 0;
  local_58.grow = 0.0;
  local_68._0_4_ = (Integration)0x0;
  local_68._4_4_ = (Policy)0x0;
  uStack_60._0_4_ = 0;
  uStack_60._4_4_ = 0;
  local_78 = 0;
  uStack_70 = 0;
  this_00 = (SolveOptions *)&local_78;
  SolveOptions::SolveOptions(this_00);
  SolveOptions::operator=(this_00,in_stack_ffffffffffffff58);
  SolveOptions::~SolveOptions((SolveOptions *)0x12104d);
  Asp::LogicProgram::AspOptions::AspOptions((AspOptions *)this_00);
  *(undefined8 *)(in_RDI + 0xb0) = local_8c;
  return;
}

Assistant:

void ClaspConfig::reset() {
	if (tester_) { tester_->reset(); }
	impl_->reset();
	BasicSatConfig::reset();
	solve = SolveOptions();
	asp   = AspOptions();
}